

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::Deserializer::deserialize<dap::Source>(Deserializer *this,optional<dap::Source> *opt)

{
  bool bVar1;
  Source v;
  Source SStack_148;
  
  Source::Source(&SStack_148);
  bVar1 = deserialize<dap::Source,std::enable_if<true,void>>(this,&SStack_148);
  if (bVar1) {
    optional<dap::Source>::operator=(opt,&SStack_148);
  }
  Source::~Source(&SStack_148);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}